

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<unsigned_int>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          uint value)

{
  ulong uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined1 *puVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  ulong __n;
  buffer<char> *c;
  undefined1 auStack_48 [32];
  
  uVar10 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar10 = (uVar10 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar10 = (uVar10 - (value < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                       (ulong)uVar10 * 4))) + 1;
  __n = (ulong)uVar10;
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + __n;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  puVar7 = auStack_48 + __n;
  uVar6 = value;
  if (99 < value) {
    do {
      value = uVar6 / 100;
      *(undefined2 *)(puVar7 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar6 % 100) * 2);
      puVar7 = puVar7 + -2;
      bVar5 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar5);
  }
  pcVar4 = pbVar2->ptr_;
  if (value < 10) {
    bVar9 = (byte)value | 0x30;
    lVar8 = -1;
  }
  else {
    puVar7[-1] = basic_data<void>::digits[((ulong)value * 2 & 0xffffffff) + 1];
    bVar9 = basic_data<void>::digits[(ulong)value * 2];
    lVar8 = -2;
  }
  puVar7[lVar8] = bVar9;
  if (uVar10 != 0) {
    memcpy(pcVar4 + sVar3,auStack_48,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }